

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::noteExternDefinition(Compilation *this,Scope *scope,SyntaxNode *syntax)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  RootSymbol *pRVar3;
  group_type_pointer pgVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  uint uVar10;
  SyntaxNode *pSVar11;
  SourceLocation SVar12;
  Diagnostic *this_00;
  Scope *pSVar13;
  ulong uVar14;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *__u;
  ulong uVar15;
  ulong pos0;
  long lVar16;
  ulong uVar17;
  ulong hash;
  undefined1 auVar18 [16];
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  string_view arg;
  string_view name;
  DiagCode in_stack_ffffffffffffff08;
  try_emplace_args_t local_e9;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
  *local_e8;
  SyntaxNode *local_e0;
  group_type_pointer local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  value_type_pointer local_a8;
  ulong local_a0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_98;
  size_t seed;
  Symbol *pSStack_78;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  Token nameToken;
  
  if (syntax->kind == ExternModuleDecl) {
    pSVar11 = (SyntaxNode *)&syntax[6].parent[2].parent;
  }
  else {
    pSVar11 = syntax + 7;
  }
  nameToken._0_8_ = *(undefined8 *)pSVar11;
  nameToken.info = (Info *)pSVar11->parent;
  arg = parsing::Token::valueText(&nameToken);
  if ((UdpPortListSyntax *)arg._M_len != (UdpPortListSyntax *)0x0) {
    pRVar3 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_98.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar3->super_Scope;
    if (pRVar3 == (RootSymbol *)0x0) {
      local_98.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
    }
    if (scope->thisSym->kind != CompilationUnit) {
      local_98.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)scope;
    }
    local_e8 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
                *)&this->externDefMap;
    seed = 0;
    local_e0 = syntax;
    local_98.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl = arg;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&seed,&local_98);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = seed;
    hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar7,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar7,0);
    pos0 = hash >> ((byte)(this->externDefMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    lVar16 = (hash & 0xff) * 4;
    uVar19 = (&UNK_00474b6c)[lVar16];
    uVar20 = (&UNK_00474b6d)[lVar16];
    uVar21 = (&UNK_00474b6e)[lVar16];
    bVar22 = (&UNK_00474b6f)[lVar16];
    uVar14 = (ulong)((uint)hash & 7);
    uVar15 = 0;
    uVar17 = pos0;
    uVar23 = uVar19;
    uVar24 = uVar20;
    uVar25 = uVar21;
    bVar26 = bVar22;
    uVar27 = uVar19;
    uVar28 = uVar20;
    uVar29 = uVar21;
    bVar30 = bVar22;
    uVar31 = uVar19;
    uVar32 = uVar20;
    uVar33 = uVar21;
    bVar34 = bVar22;
    do {
      pgVar4 = (this->externDefMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
               .arrays.groups_;
      pgVar2 = pgVar4 + uVar17;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bVar9 = pgVar2->m[0xf].n;
      auVar18[0] = -(local_58 == uVar19);
      auVar18[1] = -(uStack_57 == uVar20);
      auVar18[2] = -(uStack_56 == uVar21);
      auVar18[3] = -(bStack_55 == bVar22);
      auVar18[4] = -(uStack_54 == uVar23);
      auVar18[5] = -(uStack_53 == uVar24);
      auVar18[6] = -(uStack_52 == uVar25);
      auVar18[7] = -(bStack_51 == bVar26);
      auVar18[8] = -(uStack_50 == uVar27);
      auVar18[9] = -(uStack_4f == uVar28);
      auVar18[10] = -(uStack_4e == uVar29);
      auVar18[0xb] = -(bStack_4d == bVar30);
      auVar18[0xc] = -(uStack_4c == uVar31);
      auVar18[0xd] = -(uStack_4b == uVar32);
      auVar18[0xe] = -(uStack_4a == uVar33);
      auVar18[0xf] = -(bVar9 == bVar34);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar9;
      if (uVar10 != 0) {
        local_d8 = pgVar4 + uVar17;
        local_a8 = (this->externDefMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                   .arrays.elements_ + uVar17 * 0xf;
        local_d0 = uVar17;
        local_c8 = uVar15;
        local_c0 = uVar14;
        local_b8 = pos0;
        local_b0 = hash;
        local_68 = uVar19;
        uStack_67 = uVar20;
        uStack_66 = uVar21;
        bStack_65 = bVar22;
        uStack_64 = uVar23;
        uStack_63 = uVar24;
        uStack_62 = uVar25;
        bStack_61 = bVar26;
        uStack_60 = uVar27;
        uStack_5f = uVar28;
        uStack_5e = uVar29;
        bStack_5d = bVar30;
        uStack_5c = uVar31;
        uStack_5b = uVar32;
        uStack_5a = uVar33;
        bStack_59 = bVar34;
        do {
          local_a0 = (ulong)uVar10;
          iVar6 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
            }
          }
          __u = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *)((long)&(local_a8->first).
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                           super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                   (ulong)(uint)(iVar6 << 5));
          bVar8 = std::
                  __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                  ::__eq(&local_98,__u);
          if (bVar8) {
            pSVar13 = __u[1].
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
            if (syntax->kind != *(SyntaxKind *)&pSVar13->compilation) {
              SVar12 = parsing::Token::location(&nameToken);
              this_00 = Scope::addDiag(scope,(DiagCode)0x2a000a,SVar12);
              Diagnostic::operator<<(this_00,arg);
              pSVar13 = __u[1].
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                        super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
              if (*(int *)&pSVar13->compilation == 0xcc) {
                pSVar13 = (Scope *)(*(long *)&pSVar13[2].deferredMemberIndex + 0x38);
              }
              else {
                pSVar13 = pSVar13 + 3;
              }
              seed = (size_t)pSVar13->compilation;
              pSStack_78 = pSVar13->thisSym;
              SVar12 = parsing::Token::location((Token *)&seed);
              Diagnostic::addNote(this_00,(DiagCode)0xa0001,SVar12);
              return;
            }
            if (syntax->kind == ExternModuleDecl) {
              checkExternModMatch(scope,(ModuleHeaderSyntax *)syntax[6].parent,
                                  *(ModuleHeaderSyntax **)&pSVar13[2].deferredMemberIndex,
                                  (DiagCode)0xc000d);
              return;
            }
            name._M_str = (char *)0xc000d;
            name._M_len = (size_t)arg._M_str;
            checkExternUdpMatch((ast *)scope,(Scope *)syntax[7].previewNode,
                                (UdpPortListSyntax *)pSVar13[3].nameMap,
                                (UdpPortListSyntax *)arg._M_len,name,in_stack_ffffffffffffff08);
            return;
          }
          uVar10 = (uint)local_a0 - 1 & (uint)local_a0;
        } while (uVar10 != 0);
        bVar9 = local_d8->m[0xf].n;
        uVar14 = local_c0;
        uVar15 = local_c8;
        pos0 = local_b8;
        uVar17 = local_d0;
        hash = local_b0;
        uVar19 = local_68;
        uVar20 = uStack_67;
        uVar21 = uStack_66;
        bVar22 = bStack_65;
        uVar23 = uStack_64;
        uVar24 = uStack_63;
        uVar25 = uStack_62;
        bVar26 = bStack_61;
        uVar27 = uStack_60;
        uVar28 = uStack_5f;
        uVar29 = uStack_5e;
        bVar30 = bStack_5d;
        uVar31 = uStack_5c;
        uVar32 = uStack_5b;
        uVar33 = uStack_5a;
        bVar34 = bStack_59;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar14] & bVar9) == 0) break;
      uVar5 = (this->externDefMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
              .arrays.groups_size_mask;
      lVar16 = uVar17 + uVar15;
      uVar15 = uVar15 + 1;
      uVar17 = lVar16 + 1U & uVar5;
    } while (uVar15 <= uVar5);
    if ((this->externDefMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
        .size_ctrl.size <
        (this->externDefMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
                ((locator *)&seed,local_e8,(arrays_type *)local_e8,pos0,hash,&local_e9,&local_98,
                 &local_e0);
      psVar1 = &(this->externDefMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
                ((locator *)&seed,local_e8,hash,&local_e9,&local_98,&local_e0);
    }
  }
  return;
}

Assistant:

void Compilation::noteExternDefinition(const Scope& scope, const SyntaxNode& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto nameToken = getExternNameToken(syntax);
    auto name = nameToken.valueText();
    if (name.empty())
        return;

    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    auto [it, inserted] = externDefMap.emplace(std::tuple(name, targetScope), &syntax);
    if (!inserted) {
        if (syntax.kind != it->second->kind) {
            auto& diag = scope.addDiag(diag::Redefinition, nameToken.location());
            diag << name;
            diag.addNote(diag::NotePreviousDefinition, getExternNameToken(*it->second).location());
        }
        else if (syntax.kind == SyntaxKind::ExternModuleDecl) {
            checkExternModMatch(scope, *syntax.as<ExternModuleDeclSyntax>().header,
                                *it->second->as<ExternModuleDeclSyntax>().header,
                                diag::ExternDeclMismatchPrev);
        }
        else {
            checkExternUdpMatch(scope, *syntax.as<ExternUdpDeclSyntax>().portList,
                                *it->second->as<ExternUdpDeclSyntax>().portList, name,
                                diag::ExternDeclMismatchPrev);
        }
    }
}